

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorLeave
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *feastol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  pointer pIVar4;
  IdxElement *keys;
  type_conflict5 tVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  pointer pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  devexpr *pdVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  ulong uVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  value_type local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar15 = 0;
  local_338.m_backend.fpclass = cpp_dec_float_finite;
  local_338.m_backend.prec_elem = 0x1c;
  local_338.m_backend.data._M_elems[0] = 0;
  local_338.m_backend.data._M_elems[1] = 0;
  local_338.m_backend.data._M_elems[2] = 0;
  local_338.m_backend.data._M_elems[3] = 0;
  local_338.m_backend.data._M_elems[4] = 0;
  local_338.m_backend.data._M_elems[5] = 0;
  local_338.m_backend.data._M_elems[6] = 0;
  local_338.m_backend.data._M_elems[7] = 0;
  local_338.m_backend.data._M_elems[8] = 0;
  local_338.m_backend.data._M_elems[9] = 0;
  local_338.m_backend.data._M_elems[10] = 0;
  local_338.m_backend.data._M_elems[0xb] = 0;
  local_338.m_backend.data._M_elems[0xc] = 0;
  local_338.m_backend.data._M_elems[0xd] = 0;
  local_338.m_backend.data._M_elems[0xe] = 0;
  local_338.m_backend.data._M_elems[0xf] = 0;
  local_338.m_backend.data._M_elems[0x10] = 0;
  local_338.m_backend.data._M_elems[0x11] = 0;
  local_338.m_backend.data._M_elems[0x12] = 0;
  local_338.m_backend.data._M_elems[0x13] = 0;
  local_338.m_backend.data._M_elems[0x14] = 0;
  local_338.m_backend.data._M_elems[0x15] = 0;
  local_338.m_backend.data._M_elems[0x16] = 0;
  local_338.m_backend.data._M_elems[0x17] = 0;
  local_338.m_backend.data._M_elems[0x18] = 0;
  local_338.m_backend.data._M_elems[0x19] = 0;
  local_338.m_backend.data._M_elems._104_5_ = 0;
  local_338.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_338.m_backend.exp = 0;
  local_338.m_backend.neg = false;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b4.val.m_backend.fpclass = cpp_dec_float_finite;
  local_2b4.val.m_backend.prec_elem = 0x1c;
  local_2b4.val.m_backend.data._M_elems[0] = 0;
  local_2b4.val.m_backend.data._M_elems[1] = 0;
  local_2b4.val.m_backend.data._M_elems[2] = 0;
  local_2b4.val.m_backend.data._M_elems[3] = 0;
  local_2b4.val.m_backend.data._M_elems[4] = 0;
  local_2b4.val.m_backend.data._M_elems[5] = 0;
  local_2b4.val.m_backend.data._M_elems[6] = 0;
  local_2b4.val.m_backend.data._M_elems[7] = 0;
  local_2b4.val.m_backend.data._M_elems[8] = 0;
  local_2b4.val.m_backend.data._M_elems[9] = 0;
  local_2b4.val.m_backend.data._M_elems[10] = 0;
  local_2b4.val.m_backend.data._M_elems[0xb] = 0;
  local_2b4.val.m_backend.data._M_elems[0xc] = 0;
  local_2b4.val.m_backend.data._M_elems[0xd] = 0;
  local_2b4.val.m_backend.data._M_elems[0xe] = 0;
  local_2b4.val.m_backend.data._M_elems[0xf] = 0;
  local_2b4.val.m_backend.data._M_elems[0x10] = 0;
  local_2b4.val.m_backend.data._M_elems[0x11] = 0;
  local_2b4.val.m_backend.data._M_elems[0x12] = 0;
  local_2b4.val.m_backend.data._M_elems[0x13] = 0;
  local_2b4.val.m_backend.data._M_elems[0x18] = 0;
  local_2b4.val.m_backend.data._M_elems[0x19] = 0;
  local_2b4.val.m_backend.data._M_elems._104_5_ = 0;
  local_2b4.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_2b4.val.m_backend.exp = 0;
  local_2b4.val.m_backend.neg = false;
  local_2b4.val.m_backend.data._M_elems[0x14] = 0;
  local_2b4.val.m_backend.data._M_elems[0x15] = 0;
  local_2b4.val.m_backend.data._M_elems[0x16] = 0;
  local_2b4.val.m_backend.data._M_elems[0x17] = 0;
  pIVar4 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar4) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar4;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  for (uVar14 = (ulong)(uint)(pSVar1->infeasibilities).super_IdxSet.num; 0 < (int)uVar14;
      uVar14 = uVar14 - 1) {
    iVar7 = (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilities).super_IdxSet.idx[uVar14 - 1];
    lVar9 = 0x1c;
    pnVar10 = pnVar2 + iVar7;
    pnVar11 = &local_338;
    for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
    }
    local_338.m_backend.exp = pnVar2[iVar7].m_backend.exp;
    local_338.m_backend.neg = pnVar2[iVar7].m_backend.neg;
    local_338.m_backend.fpclass = pnVar2[iVar7].m_backend.fpclass;
    local_338.m_backend.prec_elem = pnVar2[iVar7].m_backend.prec_elem;
    pnVar11 = feastol;
    pnVar13 = &result;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar5 = boost::multiprecision::operator<(&local_338,&result);
    if (tVar5) {
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasible).data[iVar7] = 1;
      local_2b4.idx = iVar7;
      lVar9 = 0x1c;
      pnVar11 = &local_338;
      pdVar12 = local_b0;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(uint *)pdVar12 = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + (ulong)bVar15 * -8 + 4);
        pdVar12 = pdVar12 + (ulong)bVar15 * -8 + 4;
      }
      local_40 = local_338.m_backend.exp;
      local_3c = local_338.m_backend.neg;
      local_38 = local_338.m_backend.fpclass;
      iStack_34 = local_338.m_backend.prec_elem;
      pnVar10 = pnVar3 + iVar7;
      pnVar11 = &local_130;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pnVar3[iVar7].m_backend.exp;
      local_130.m_backend.neg = pnVar3[iVar7].m_backend.neg;
      local_130.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
      local_130.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
      pnVar11 = feastol;
      pnVar13 = &local_1b0;
      for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (feastol->m_backend).exp;
      local_1b0.m_backend.neg = (feastol->m_backend).neg;
      local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar11 = &result;
      pnVar13 = &local_2b4.val;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar15 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar15 * -2 + 1) * 4);
      }
      local_2b4.val.m_backend.exp = result.m_backend.exp;
      local_2b4.val.m_backend.neg = result.m_backend.neg;
      local_2b4.val.m_backend.fpclass = result.m_backend.fpclass;
      local_2b4.val.m_backend.prec_elem = result.m_backend.prec_elem;
      std::
      vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ::push_back(&(this->prices).data,&local_2b4);
    }
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar4 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  lVar9 = 0;
  uVar6 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)(((long)pIVar4 - (long)keys) / 0x84),100,0,0,true);
  uVar14 = 0;
  if (0 < (int)uVar6) {
    uVar14 = (ulong)uVar6;
  }
  for (; uVar14 * 0x84 - lVar9 != 0; lVar9 = lVar9 + 0x84) {
    DIdxSet::addIdx(&this->bestPrices,
                    *(int *)((long)&(((this->prices).data.
                                      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                            lVar9 + -4));
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data
    [*(int *)((long)&(((this->prices).data.
                       super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar9 + -4)] = 2
    ;
  }
  if ((int)uVar6 < 1) {
    iVar7 = -1;
  }
  else {
    iVar7 = ((this->prices).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start)->idx;
  }
  return iVar7;
}

Assistant:

int SPxDevexPR<R>::buildBestPriceVectorLeave(R feastol)
{
   int idx;
   int nsorted;
   R fTesti;
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // TODO we should check infeasiblities for duplicates or loop over dimension
   //      bestPrices may then also contain duplicates!
   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      fTesti = fTest[idx];

      if(fTesti < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(fTesti, cpen[idx], feastol);
         prices.append(price);
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
      return prices[0].idx;
   else
      return -1;
}